

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

XmlWriter * __thiscall Catch::XmlWriter::writeAttribute(XmlWriter *this,string *name,bool attribute)

{
  char *pcVar1;
  ostream *poVar2;
  undefined7 in_register_00000011;
  char local_1a [2];
  
  local_1a[0] = ' ';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(this->m_os,local_1a,1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"=\"",2);
  pcVar1 = "we move a directory and overwrite = false";
  if ((int)CONCAT71(in_register_00000011,attribute) != 0) {
    pcVar1 = "we move a directory and overwrite = true";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,pcVar1 + 0x24,CONCAT71(in_register_00000011,attribute) & 0xffffffff ^ 5);
  local_1a[1] = 0x22;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_1a + 1,1);
  return this;
}

Assistant:

XmlWriter &XmlWriter::writeAttribute(std::string const &name, bool attribute) {
        m_os << ' ' << name << "=\"" << (attribute ? "true" : "false") << '"';
        return *this;
    }